

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O1

DimensionEstimate *
ZXing::QRCode::EstimateDimension
          (DimensionEstimate *__return_storage_ptr__,BitMatrix *image,ConcentricPattern a,
          ConcentricPattern b)

{
  double dVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  double dVar8;
  
  dVar1 = EstimateModuleSize(image,a,b);
  dVar8 = EstimateModuleSize(image,b,a);
  if ((dVar1 < 0.0) || (dVar8 < 0.0)) {
    __return_storage_ptr__->dim = 0;
    __return_storage_ptr__->ms = 0.0;
    __return_storage_ptr__->err = 4;
  }
  else {
    dVar8 = (dVar1 + dVar8) * 0.5;
    dVar1 = (a.super_PointF.x - b.super_PointF.x) * (a.super_PointF.x - b.super_PointF.x) +
            (a.super_PointF.y - b.super_PointF.y) * (a.super_PointF.y - b.super_PointF.y);
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    lVar3 = lround(dVar1 / dVar8);
    iVar2 = (int)lVar3;
    uVar4 = iVar2 + 7;
    uVar6 = iVar2 + 10;
    if (-1 < (int)uVar4) {
      uVar6 = uVar4;
    }
    iVar7 = (uVar6 & 0xfffffffc) - uVar4;
    iVar5 = iVar7 + 1;
    __return_storage_ptr__->dim = iVar2 + iVar7 + 8;
    __return_storage_ptr__->ms = dVar8;
    iVar2 = -iVar5;
    if (0 < iVar5) {
      iVar2 = iVar5;
    }
    __return_storage_ptr__->err = iVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

static DimensionEstimate EstimateDimension(const BitMatrix& image, ConcentricPattern a, ConcentricPattern b)
{
	auto ms_a = EstimateModuleSize(image, a, b);
	auto ms_b = EstimateModuleSize(image, b, a);

	if (ms_a < 0 || ms_b < 0)
		return {};

	auto moduleSize = (ms_a + ms_b) / 2;

	int dimension = narrow_cast<int>(std::lround(distance(a, b) / moduleSize) + 7);
	int error     = 1 - (dimension % 4);

	return {dimension + error, moduleSize, std::abs(error)};
}